

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:1284:26)>
::getImpl(SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
          *this,ExceptionOrValue *output)

{
  Exception *exception;
  ExceptionOr<int> *pEVar1;
  int *in;
  int local_52c;
  ExceptionOr<int> local_528;
  int *local_388;
  int *depValue;
  int *_depValue779;
  Exception *local_1d8;
  Exception *depException;
  Exception *_depException777;
  undefined1 local_1b8 [8];
  ExceptionOr<int> depResult;
  ExceptionOrValue *output_local;
  SimpleTransformPromiseNode<int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:1284:26)>
  *this_local;
  
  depResult.value.ptr = (NullableValue<int>)output;
  ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)local_1b8);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b8);
  depException = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b8);
  if (depException == (Exception *)0x0) {
    depValue = readMaybe<int>((Maybe<int> *)
                              ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1.value.
                                      details.builder + 0x18));
    if (depValue != (int *)0x0) {
      local_388 = depValue;
      in = mv<int>(depValue);
      local_52c = MaybeVoidCaller<int,int>::
                  apply<kj::(anonymous_namespace)::TestCase1273::run()::__1>(&this->func,in);
      TransformPromiseNodeBase::handle<int>
                (&local_528,&this->super_TransformPromiseNodeBase,&local_52c);
      pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
      ExceptionOr<int>::operator=(pEVar1,&local_528);
      ExceptionOr<int>::~ExceptionOr(&local_528);
    }
  }
  else {
    local_1d8 = depException;
    exception = mv<kj::Exception>(depException);
    ExceptionOr<int>::ExceptionOr((ExceptionOr<int> *)&_depValue779,false,exception);
    pEVar1 = ExceptionOrValue::as<int>((ExceptionOrValue *)depResult.value.ptr);
    ExceptionOr<int>::operator=(pEVar1,(ExceptionOr<int> *)&_depValue779);
    ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)&_depValue779);
  }
  ExceptionOr<int>::~ExceptionOr((ExceptionOr<int> *)local_1b8);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }